

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

int __thiscall
CVmObjFrameRef::index_val_q
          (CVmObjFrameRef *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val)

{
  int iVar1;
  vm_frameref_ext *pvVar2;
  vm_val_t *pvVar3;
  int *in_RCX;
  undefined8 *in_RSI;
  CVmObjFrameRef *in_RDI;
  int n;
  vm_frameref_ext *ext;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  pvVar2 = get_ext(in_RDI);
  if (*in_RCX != 7) {
    err_throw(0);
  }
  iVar1 = in_RCX[2];
  if ((-1 < iVar1) && (iVar1 < pvVar2->nlocals + pvVar2->nparams)) {
    if (pvVar2->fp == (vm_val_t *)0x0) {
      *in_RSI = *(undefined8 *)(pvVar2->vars + iVar1);
      *(anon_union_8_8_cb74652f_for_val *)(in_RSI + 1) = pvVar2->vars[iVar1].val;
    }
    else if (iVar1 < pvVar2->nlocals) {
      pvVar3 = CVmRun::get_local_from_frame
                         ((vm_val_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      *in_RSI = *(undefined8 *)pvVar3;
      *(anon_union_8_8_cb74652f_for_val *)(in_RSI + 1) = pvVar3->val;
    }
    else {
      pvVar3 = CVmRun::get_param_from_frame
                         ((vm_val_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      *in_RSI = *(undefined8 *)pvVar3;
      *(anon_union_8_8_cb74652f_for_val *)(in_RSI + 1) = pvVar3->val;
    }
    return 1;
  }
  err_throw(0);
}

Assistant:

int CVmObjFrameRef::index_val_q(VMG_ vm_val_t *result,
                                vm_obj_id_t self,
                                const vm_val_t *index_val)
{
    /* get our extension */
    vm_frameref_ext *ext = get_ext();

    /* check the type */
    if (index_val->typ == VM_INT)
    {
        /* 
         *   It's a direct index into the frame.  Make sure the value is in
         *   range.  
         */
        int n = index_val->val.intval;
        if (n < 0 || n >= ext->nlocals + ext->nparams)
            err_throw(VMERR_INDEX_OUT_OF_RANGE);

        /*  
         *   If we have an active stack frame, read the value from the stack;
         *   otherwise read it from the snapshot array.  
         */
        if (ext->fp != 0)
        {
            /* get it from the stack frame */
            if (n < ext->nlocals)
            {
                /* it's in the local variable range */
                *result =
                    *G_interpreter->get_local_from_frame(vmg_ ext->fp, n);
            }
            else
            {
                /* it's in the parameter range */
                *result = *G_interpreter->get_param_from_frame(
                    vmg_ ext->fp, n - ext->nlocals);
            }
        }
        else
        {
            /* there's no frame - get it from the snapshot array */
            *result = ext->vars[n];
        }
    }
    else
    {
        /* invalid index type */
        err_throw(VMERR_INDEX_OUT_OF_RANGE);
    }

    /* handled */
    return TRUE;
}